

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int doHardCopy)

{
  int iVar1;
  int p1;
  int op;
  int inReg;
  Expr *pExpr;
  int n;
  int i;
  ExprList_item *pItem;
  int doHardCopy_local;
  int target_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  iVar1 = pList->nExpr;
  _n = pList->a;
  for (pExpr._4_4_ = 0; pExpr._4_4_ < iVar1; pExpr._4_4_ = pExpr._4_4_ + 1) {
    p1 = sqlite3ExprCodeTarget(pParse,_n->pExpr,target + pExpr._4_4_);
    if (p1 != target + pExpr._4_4_) {
      op = 0xf;
      if (doHardCopy != 0) {
        op = 0xe;
      }
      sqlite3VdbeAddOp2(pParse->pVdbe,op,p1,target + pExpr._4_4_);
    }
    _n = _n + 1;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int doHardCopy     /* Make a hard copy of every element */
){
  struct ExprList_item *pItem;
  int i, n;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
    int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
    if( inReg!=target+i ){
      sqlite3VdbeAddOp2(pParse->pVdbe, doHardCopy ? OP_Copy : OP_SCopy,
                        inReg, target+i);
    }
  }
  return n;
}